

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,double>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  data_ptr_t pdVar1;
  undefined8 uVar2;
  char *pcVar9;
  sel_t *psVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  idx_t count_00;
  char *pcVar14;
  ulong uVar15;
  undefined4 uVar16;
  string_t new_value;
  SelectionVector sel;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  Vector sort_key;
  UnifiedVectorFormat adata;
  Vector sliced_input;
  sel_t assign_sel [2048];
  SelectionVector local_2210;
  LogicalType local_21f8;
  UnifiedVectorFormat local_21e0;
  UnifiedVectorFormat local_2198;
  Vector local_2150;
  UnifiedVectorFormat local_20e8;
  Vector local_20a0;
  sel_t local_2038 [2050];
  undefined1 uVar3;
  undefined1 uVar4;
  undefined3 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_20e8);
  Vector::ToUnifiedFormat(inputs,count,&local_20e8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_2198);
  Vector::ToUnifiedFormat(inputs + 1,count,&local_2198);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_21e0);
  Vector::ToUnifiedFormat(state_vector,count,&local_21e0);
  if (count != 0) {
    pcVar14 = (char *)0x0;
    count_00 = 0;
    uVar15 = 0;
    do {
      uVar12 = uVar15;
      if ((local_2198.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(local_2198.sel)->sel_vector[uVar15];
      }
      if ((local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6]
           >> (uVar12 & 0x3f) & 1) != 0)) {
        pdVar1 = local_2198.data + uVar12 * 8;
        uVar2._0_1_ = pdVar1[0];
        uVar2._1_1_ = pdVar1[1];
        uVar2._2_1_ = pdVar1[2];
        uVar2._3_1_ = pdVar1[3];
        uVar3 = pdVar1[4];
        uVar4 = pdVar1[5];
        uVar6 = pdVar1[6];
        uVar8 = pdVar1[7];
        uVar7 = CONCAT11(uVar8,uVar6);
        uVar5 = CONCAT21(uVar7,uVar4);
        uVar2._4_4_ = CONCAT31(uVar5,uVar3);
        uVar16 = (undefined4)uVar2;
        uVar12 = uVar15;
        if ((local_20e8.sel)->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)(local_20e8.sel)->sel_vector[uVar15];
        }
        local_2150._0_8_ = uVar2;
        if ((local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)) {
          uVar12 = uVar15;
          if ((local_21e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar12 = (ulong)(local_21e0.sel)->sel_vector[uVar15];
          }
          pcVar9 = *(char **)(local_21e0.data + uVar12 * 8);
          if (*pcVar9 == '\x01') {
            bVar11 = GreaterThan::Operation<double>((double *)&local_2150,(double *)(pcVar9 + 0x18))
            ;
            if (!bVar11) goto LAB_0197fefe;
            uVar16 = local_2150._0_4_;
            uVar2._4_4_ = local_2150._4_4_;
          }
          *(ulong *)(pcVar9 + 0x18) = CONCAT44(uVar2._4_4_,uVar16);
          pcVar9[1] = '\0';
          lVar13 = count_00 - (pcVar9 == pcVar14);
          local_2038[lVar13] = (sel_t)uVar15;
          count_00 = lVar13 + 1;
          *pcVar9 = '\x01';
          pcVar14 = pcVar9;
        }
      }
LAB_0197fefe:
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
    if (count_00 != 0) {
      LogicalType::LogicalType(&local_21f8,BLOB);
      Vector::Vector(&local_2150,&local_21f8,0x800);
      LogicalType::~LogicalType(&local_21f8);
      local_2210.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2210.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2210.sel_vector = local_2038;
      Vector::Vector(&local_20a0,inputs,&local_2210,count_00);
      CreateSortKeyHelpers::CreateSortKey(&local_20a0,count_00,(OrderModifiers)0x303,&local_2150);
      local_2150.data = local_2150.data + 8;
      uVar15 = 0;
      do {
        uVar12 = uVar15;
        if (local_2210.sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)local_2210.sel_vector[uVar15];
        }
        psVar10 = (local_21e0.sel)->sel_vector;
        if (psVar10 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar10[uVar12];
        }
        new_value.value.pointer.ptr = (char *)psVar10;
        new_value.value._0_8_ = *(undefined8 *)local_2150.data;
        ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                  ((ArgMinMaxStateBase *)(*(long *)(local_21e0.data + uVar12 * 8) + 8),
                   *(string_t **)(local_2150.data + -8),new_value);
        uVar15 = uVar15 + 1;
        local_2150.data = local_2150.data + 0x10;
      } while (count_00 != uVar15);
      if (local_20a0.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20a0.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_20a0.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20a0.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&local_20a0.type);
      if (local_2210.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2210.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_2150.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2150.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2150.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2150.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2150.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&local_2150.type);
    }
  }
  if (local_21e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_21e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_21e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_21e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2198.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2198.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20e8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20e8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}